

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O3

bool __thiscall irr::scene::CMeshCache::renameMesh(CMeshCache *this,IMesh *mesh,path *name)

{
  undefined1 *this_00;
  IMesh *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = *(long *)&(this->super_IMeshCache).field_0x8;
  lVar3 = *(long *)&(this->super_IMeshCache).field_0x10;
  if ((int)((ulong)(lVar3 - lVar5) >> 3) * 0x38e38e39 != 0) {
    this_00 = &(this->super_IMeshCache).field_0x8;
    lVar6 = 0;
    uVar4 = 0;
    do {
      pIVar1 = *(IMesh **)(lVar5 + 0x40 + lVar6);
      if (pIVar1 == mesh) {
LAB_001c7439:
        irr::io::SNamedPath::setPath((SNamedPath *)(lVar5 + lVar6),name);
        core::array<irr::scene::CMeshCache::MeshEntry>::sort
                  ((array<irr::scene::CMeshCache::MeshEntry> *)this_00);
        return true;
      }
      if (pIVar1 != (IMesh *)0x0) {
        iVar2 = (*pIVar1->_vptr_IMesh[0xd])(pIVar1,0,0xff,0xffffffff,0xffffffff);
        lVar5 = *(long *)this_00;
        if ((IMesh *)CONCAT44(extraout_var,iVar2) == mesh) goto LAB_001c7439;
        lVar3 = *(long *)&(this->super_IMeshCache).field_0x10;
      }
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x48;
    } while (uVar4 < (uint)((int)((ulong)(lVar3 - lVar5) >> 3) * 0x38e38e39));
  }
  return false;
}

Assistant:

bool CMeshCache::renameMesh(const IMesh *const mesh, const io::path &name)
{
	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh)) {
			Meshes[i].NamedPath.setPath(name);
			Meshes.sort();
			return true;
		}
	}

	return false;
}